

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O2

_Bool xdr_string_decode(XDR *xdrs,char **cpp,u_int maxsize)

{
  _Bool _Var1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t size;
  char local_2c [4];
  
  pcVar2 = *cpp;
  _Var1 = xdr_getuint32(xdrs,&size);
  if (!_Var1) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR size","xdr_string_decode",0x3a7);
    return false;
  }
  uVar6 = (ulong)size;
  if (9000 < uVar6) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR size %u > max %u","xdr_string_decode",0x3ae,uVar6,9000);
    return false;
  }
  uVar7 = uVar6 + 1;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)(*__ntirpc_pkg_params.malloc_)
                               (uVar7,
                                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/ntirpc/rpc/xdr_inline.h"
                                ,0x3c1,"xdr_string_decode");
    uVar6 = (ulong)size;
  }
  uVar5 = (uint)uVar6;
  if (uVar5 == 0) {
LAB_001151c7:
    pcVar2[size] = '\0';
    *cpp = pcVar2;
    return true;
  }
  _Var1 = (*xdrs->x_ops->x_getbytes)(xdrs,pcVar2,uVar5);
  if (_Var1) {
    if (((uVar6 & 3) == 0) ||
       (_Var1 = (*xdrs->x_ops->x_getbytes)(xdrs,local_2c,4 - (uVar5 & 3)), _Var1))
    goto LAB_001151c7;
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_0011521b;
    pcVar4 = "%s:%u ERROR crud";
    uVar3 = 0x1c9;
  }
  else {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_0011521b;
    pcVar4 = "%s:%u ERROR opaque";
    uVar3 = 0x1b9;
  }
  (*__ntirpc_pkg_params.warnx_)(pcVar4,"xdr_opaque_decode",uVar3);
LAB_0011521b:
  (*__ntirpc_pkg_params.free_size_)(pcVar2,uVar7 & 0xffffffff);
  return false;
}

Assistant:

static inline bool
xdr_string_decode(XDR *xdrs, char **cpp, u_int maxsize)
{
	char *sp = *cpp;	/* sp is the actual string pointer */
	uint32_t size;
	u_int nodesize;
	bool ret;

	/*
	 * first deal with the length since xdr strings are counted-strings
	 */
	if (!XDR_GETUINT32(xdrs, &size)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size",
			__func__, __LINE__);
		return (false);
	}

	if (size > maxsize) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size %" PRIu32 " > max %u",
			__func__, __LINE__,
			size, maxsize);
		return (false);
	}

	nodesize = (uint32_t)(size + 1);
	if (nodesize < (size + 1)) {
		/* caller provided very large maxsize */
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR overflow %" PRIu32,
			__func__, __LINE__,
			size);
		return (false);
	}

	/*
	 * now deal with the actual bytes
	 */
	if (!sp)
		sp = (char *)mem_alloc(nodesize);

	ret = xdr_opaque_decode(xdrs, sp, size);
	if (!ret) {
		mem_free(sp, nodesize);
		return (ret);
	}
	sp[size] = '\0';
	*cpp = sp;			/* only valid pointer */
	return (ret);
}